

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCallSimplifierVisitor.cpp
# Opt level: O2

void __thiscall
IRT::CCallSimplifierVisitor::Visit(CCallSimplifierVisitor *this,CEseqExpression *expression)

{
  CStatement *pCVar1;
  CExpression *pCVar2;
  CEseqExpression *this_00;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_20;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_18;
  
  pCVar1 = CEseqExpression::getStatement(expression);
  (**(pCVar1->super_IStatement).super_INode._vptr_INode)(pCVar1,this);
  pCVar2 = CEseqExpression::getExpression(expression);
  (**(pCVar2->super_IExpression).super_INode._vptr_INode)(pCVar2,this);
  this_00 = (CEseqExpression *)operator_new(0x18);
  local_18._M_head_impl =
       (this->childStatement)._M_t.
       super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
       super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
  (this->childStatement)._M_t.
  super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
  super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)0x0;
  local_20._M_head_impl =
       (this->childExpression)._M_t.
       super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
       .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  CEseqExpression::CEseqExpression
            (this_00,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                      *)&local_18,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_20);
  pCVar2 = (this->childExpression)._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)this_00;
  if (pCVar2 != (CExpression *)0x0) {
    (**(code **)((long)(pCVar2->super_IExpression).super_INode + 0x10))();
  }
  if (local_20._M_head_impl != (CExpression *)0x0) {
    (*((local_20._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  local_20._M_head_impl = (CExpression *)0x0;
  if (local_18._M_head_impl != (CStatement *)0x0) {
    (*((local_18._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
  }
  return;
}

Assistant:

void IRT::CCallSimplifierVisitor::Visit(const CEseqExpression &expression) {
    expression.getStatement()->Accept(*this);
    expression.getExpression()->Accept(*this);

    childExpression = std::unique_ptr<const CExpression>(
            new CEseqExpression(std::move(childStatement), std::move(childExpression))
    );
}